

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O0

EGLint eglu::apiRenderableType(ApiType apiType)

{
  Profile PVar1;
  int iVar2;
  ApiType local_10 [2];
  ApiType apiType_local;
  
  local_10[0].m_bits = apiType.m_bits;
  PVar1 = glu::ApiType::getProfile(local_10);
  if (PVar1 == PROFILE_ES) {
    iVar2 = glu::ApiType::getMajorVersion(local_10);
    if (iVar2 == 1) {
      return 1;
    }
    if (iVar2 == 2) {
      return 4;
    }
    if (iVar2 == 3) {
      return 0x40;
    }
  }
  else if (PVar1 == PROFILE_CORE || PVar1 == PROFILE_COMPATIBILITY) {
    return 8;
  }
  return 0;
}

Assistant:

EGLint apiRenderableType (glu::ApiType apiType)
{
	switch (apiType.getProfile())
	{
		case glu::PROFILE_CORE:
		case glu::PROFILE_COMPATIBILITY:
			return EGL_OPENGL_BIT;
		case glu::PROFILE_ES:
			switch (apiType.getMajorVersion())
			{
				case 1:		return EGL_OPENGL_ES_BIT;
				case 2:		return EGL_OPENGL_ES2_BIT;
				case 3:		return EGL_OPENGL_ES3_BIT_KHR;
				default:	DE_FATAL("Unknown OpenGL ES version");
			}
		default:
			DE_FATAL("Unknown GL API");
	}

	return 0;
}